

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR NpyArray::LoadArrayNPZ(FILE *fp,string *varname,NpyArray *arr)

{
  __type_conflict _Var1;
  size_t sVar2;
  char *pcVar3;
  char localHeader [32];
  string vname;
  
  sVar2 = fread(localHeader,1,0x1e,(FILE *)fp);
  if (sVar2 != 0x1e) {
    return "error: failed fread";
  }
  if (localHeader[2] != '\x03') {
    return (LPCSTR)0x1;
  }
  if (localHeader[3] != '\x04') {
    return (LPCSTR)0x1;
  }
  vname._M_dataplus._M_p = (pointer)&vname.field_2;
  std::__cxx11::string::_M_construct((ulong)&vname,(char)localHeader._26_2_);
  sVar2 = fread(vname._M_dataplus._M_p,1,(ulong)(ushort)localHeader._26_2_,(FILE *)fp);
  if (sVar2 != (ushort)localHeader._26_2_) {
    pcVar3 = "error: failed fread";
    goto LAB_001222f6;
  }
  std::__cxx11::string::erase
            (&vname,vname._M_dataplus._M_p + (vname._M_string_length - 4),
             vname._M_dataplus._M_p + vname._M_string_length);
  fseek((FILE *)fp,(ulong)(ushort)localHeader._28_2_,1);
  if (varname->_M_string_length == 0) {
LAB_00122298:
    std::__cxx11::string::_M_assign((string *)varname);
  }
  else {
    _Var1 = std::operator==(varname,&vname);
    if (!_Var1) {
      fseek((FILE *)fp,(ulong)(uint)localHeader._22_4_,1);
      pcVar3 = (LPCSTR)0x0;
      goto LAB_001222f6;
    }
    if (varname->_M_string_length == 0) goto LAB_00122298;
  }
  if (localHeader._8_2_ == 0) {
    pcVar3 = LoadNPY(arr,fp);
  }
  else {
    pcVar3 = LoadNPZ(arr,fp,localHeader._18_4_,localHeader._22_4_);
  }
LAB_001222f6:
  std::__cxx11::string::~string((string *)&vname);
  return pcVar3;
}

Assistant:

LPCSTR NpyArray::LoadArrayNPZ(FILE* fp, std::string& varname, NpyArray& arr)
{
	char localHeader[32];
	if (fread(localHeader, sizeof(char), 30, fp) != 30)
		return "error: failed fread";

	// if we've reached the global header, stop reading
	if (localHeader[2] != 0x03 || localHeader[3] != 0x04)
		return (const char*)1;

	// read in the variable name
	const uint16_t lenName = *reinterpret_cast<uint16_t*>(localHeader+26);
	std::string vname(lenName, ' ');
	if (fread(&vname[0], sizeof(char), lenName, fp) != lenName)
		return "error: failed fread";

	// erase the lagging .npy        
	vname.erase(vname.end()-4, vname.end());

	// read in the extra field
	const uint16_t lenExtraField = *reinterpret_cast<uint16_t*>(localHeader+28);
	fseek(fp, lenExtraField, SEEK_CUR); // skip past the extra field

	if (varname.empty() || varname == vname) {
		// read current array
		if (varname.empty())
			varname = vname;
		const uint16_t comprMethod = *reinterpret_cast<uint16_t*>(localHeader+8);
		if (comprMethod == 0)
			return arr.LoadNPY(fp);
		const uint32_t comprBytes = *reinterpret_cast<uint32_t*>(localHeader+18);
		const uint32_t uncomprBytes = *reinterpret_cast<uint32_t*>(localHeader+22);
		return arr.LoadNPZ(fp, comprBytes, uncomprBytes);
	}

	// skip current array data
	const uint32_t size = *reinterpret_cast<uint32_t*>(localHeader+22);
	fseek(fp, size, SEEK_CUR);
	return NULL;
}